

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  pointer pIVar1;
  bool bVar2;
  size_t j;
  ulong uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Stats *pSVar5;
  long lVar6;
  long lVar7;
  int x;
  long lVar8;
  ulong uVar9;
  Image *pIVar10;
  Float FVar11;
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  optional<int> oStack_88;
  optional<float> oStack_80;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_78;
  undefined8 uStack_70;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_68;
  
  pSVar5 = this->stats;
  std::operator+(&n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    pixelStatsBaseName_abi_cxx11_,"-time.exr");
  _Stack_68.super__Rb_tree_header._M_header._M_left = &_Stack_68.super__Rb_tree_header._M_header;
  aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_70._0_1_ = false;
  uStack_70._1_7_ = 0;
  _Stack_68._0_8_ = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_68.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  aStack_a8._0_8_ = 0;
  aStack_a8._8_8_ = 0;
  uStack_98 = 0;
  local_90 = 0;
  oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_88.set = false;
  oStack_88._5_3_ = 0;
  oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_80.set = false;
  oStack_80._5_3_ = 0;
  local_f8 = ZEXT1664(ZEXT816(0));
  local_138 = ZEXT1664(ZEXT816(0));
  _Stack_68.super__Rb_tree_header._M_node_count = 0;
  _Stack_68.super__Rb_tree_header._M_header._M_right =
       _Stack_68.super__Rb_tree_header._M_header._M_left;
  bVar2 = Image::Write(&pSVar5->pixelTime,&n,(ImageMetadata *)local_138);
  if (!bVar2) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  ImageMetadata::~ImageMetadata((ImageMetadata *)local_138);
  std::__cxx11::string::~string((string *)&n);
  uVar9 = 0;
  do {
    pSVar5 = this->stats;
    if ((ulong)(((long)(pSVar5->pixelCounterImages).
                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pSVar5->pixelCounterImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x118) <= uVar9) {
      uVar9 = 0;
      do {
        if ((ulong)(((long)(pSVar5->pixelRatioImages).
                           super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pSVar5->pixelRatioImages).
                          super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x118) <= uVar9) {
          return;
        }
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pixelStatsBaseName_abi_cxx11_,"-");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_158,
                       (this->stats->pixelRatioNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar9);
        std::operator+(&n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_138,".exr");
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)&local_158);
        for (uVar3 = 0; uVar3 < n._M_string_length; uVar3 = uVar3 + 1) {
          if (n._M_dataplus._M_p[uVar3] == '/') {
            n._M_dataplus._M_p[uVar3] = '_';
          }
        }
        lVar7 = 0;
        pIVar1 = (this->stats->pixelRatioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        TVar4 = pIVar1[uVar9].resolution.super_Tuple2<pbrt::Point2,_int>;
        pIVar10 = pIVar1 + uVar9;
        for (lVar6 = 0; lVar6 < (long)TVar4 >> 0x20; lVar6 = lVar6 + 1) {
          lVar8 = 0;
          while (TVar4 = (pIVar10->resolution).super_Tuple2<pbrt::Point2,_int>, lVar8 < TVar4.x) {
            WrapMode2D::WrapMode2D((WrapMode2D *)&local_158,Clamp);
            Image::GetChannels((ImageChannelValues *)local_138,pIVar10,(Point2i)(lVar7 + lVar8),
                               (WrapMode2D)local_158._M_dataplus._M_p);
            FVar11 = ImageChannelValues::MaxValue((ImageChannelValues *)local_138);
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       local_138);
            lVar8 = lVar8 + 1;
            if ((FVar11 != 0.0) || (NAN(FVar11))) {
              local_138 = ZEXT1264(ZEXT812(0));
              _Stack_68.super__Rb_tree_header._M_header._M_left =
                   &_Stack_68.super__Rb_tree_header._M_header;
              aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                           )0x0;
              uStack_70._0_1_ = false;
              uStack_70._1_7_ = 0;
              _Stack_68._0_8_ = 0;
              _Stack_68.super__Rb_tree_header._M_header._M_color = _S_red;
              _Stack_68.super__Rb_tree_header._M_header._4_4_ = 0;
              _Stack_68.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              uStack_b8 = 0;
              uStack_b0 = 0;
              aStack_a8._0_8_ = 0;
              aStack_a8._8_8_ = 0;
              uStack_98 = 0;
              local_90 = 0;
              oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
              oStack_88.set = false;
              oStack_88._5_3_ = 0;
              oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              oStack_80.set = false;
              oStack_80._5_3_ = 0;
              _Stack_68.super__Rb_tree_header._M_node_count = 0;
              local_f8 = local_138;
              _Stack_68.super__Rb_tree_header._M_header._M_right =
                   _Stack_68.super__Rb_tree_header._M_header._M_left;
              bVar2 = Image::Write((this->stats->pixelRatioImages).
                                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar9,&n,
                                   (ImageMetadata *)local_138);
              if (!bVar2) {
                LogFatal<char_const(&)[36]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                           ,0x1e2,"Check failed: %s",
                           (char (*) [36])"stats->pixelRatioImages[i].Write(n)");
              }
              ImageMetadata::~ImageMetadata((ImageMetadata *)local_138);
              goto LAB_004a7c48;
            }
          }
          lVar7 = lVar7 + 0x100000000;
        }
LAB_004a7c48:
        std::__cxx11::string::~string((string *)&n);
        pSVar5 = this->stats;
        uVar9 = uVar9 + 1;
      } while( true );
    }
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pixelStatsBaseName_abi_cxx11_,"-");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_158,
                   (this->stats->pixelCounterNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9);
    std::operator+(&n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138
                   ,".exr");
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)&local_158);
    for (uVar3 = 0; uVar3 < n._M_string_length; uVar3 = uVar3 + 1) {
      if (n._M_dataplus._M_p[uVar3] == '/') {
        n._M_dataplus._M_p[uVar3] = '_';
      }
    }
    lVar7 = 0;
    pIVar1 = (this->stats->pixelCounterImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar4 = pIVar1[uVar9].resolution.super_Tuple2<pbrt::Point2,_int>;
    pIVar10 = pIVar1 + uVar9;
    for (lVar6 = 0; lVar6 < (long)TVar4 >> 0x20; lVar6 = lVar6 + 1) {
      lVar8 = 0;
      while (TVar4 = (pIVar10->resolution).super_Tuple2<pbrt::Point2,_int>, lVar8 < TVar4.x) {
        WrapMode2D::WrapMode2D((WrapMode2D *)local_138,Clamp);
        FVar11 = Image::GetChannel(pIVar10,(Point2i)(lVar7 + lVar8),0,(WrapMode2D)local_138._0_8_);
        lVar8 = lVar8 + 1;
        if ((FVar11 != 0.0) || (NAN(FVar11))) {
          local_138 = ZEXT1264(ZEXT812(0));
          _Stack_68.super__Rb_tree_header._M_header._M_left =
               &_Stack_68.super__Rb_tree_header._M_header;
          aStack_78 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                       )0x0;
          uStack_70._0_1_ = false;
          uStack_70._1_7_ = 0;
          _Stack_68._0_8_ = 0;
          _Stack_68.super__Rb_tree_header._M_header._M_color = _S_red;
          _Stack_68.super__Rb_tree_header._M_header._4_4_ = 0;
          _Stack_68.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          uStack_b8 = 0;
          uStack_b0 = 0;
          aStack_a8._0_8_ = 0;
          aStack_a8._8_8_ = 0;
          uStack_98 = 0;
          local_90 = 0;
          oStack_88.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          oStack_88.set = false;
          oStack_88._5_3_ = 0;
          oStack_80.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          oStack_80.set = false;
          oStack_80._5_3_ = 0;
          _Stack_68.super__Rb_tree_header._M_node_count = 0;
          local_f8 = local_138;
          _Stack_68.super__Rb_tree_header._M_header._M_right =
               _Stack_68.super__Rb_tree_header._M_header._M_left;
          bVar2 = Image::Write((this->stats->pixelCounterImages).
                               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl
                               .super__Vector_impl_data._M_start + uVar9,&n,
                               (ImageMetadata *)local_138);
          if (!bVar2) {
            LogFatal<char_const(&)[38]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                       ,0x1d1,"Check failed: %s",
                       (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
          }
          ImageMetadata::~ImageMetadata((ImageMetadata *)local_138);
          goto LAB_004a7a47;
        }
      }
      lVar7 = lVar7 + 0x100000000;
    }
LAB_004a7a47:
    std::__cxx11::string::~string((string *)&n);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}